

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Huffman.c
# Opt level: O0

void createHuffmanTree(HuffmanTree *huffmanTree,int *w,int n)

{
  int n_00;
  void *pvVar1;
  int local_30;
  int local_2c;
  int i_1;
  int i;
  int s2;
  int s1;
  int m;
  int n_local;
  int *w_local;
  HuffmanTree *huffmanTree_local;
  
  s2 = n * 2 + -1;
  s1 = n;
  _m = w;
  w_local = (int *)huffmanTree;
  pvVar1 = malloc((long)(n * 2) << 4);
  *(void **)w_local = pvVar1;
  for (local_2c = 1; local_30 = s1, local_2c <= s1; local_2c = local_2c + 1) {
    *(int *)(*(long *)w_local + (long)local_2c * 0x10) = _m[local_2c];
    *(undefined4 *)(*(long *)w_local + (long)local_2c * 0x10 + 8) = 0;
    *(undefined4 *)(*(long *)w_local + (long)local_2c * 0x10 + 4) = 0;
    *(undefined4 *)(*(long *)w_local + (long)local_2c * 0x10 + 0xc) = 0;
  }
  while (local_30 = local_30 + 1, local_30 <= s2) {
    *(undefined4 *)(*(long *)w_local + (long)local_30 * 0x10) = 0;
    *(undefined4 *)(*(long *)w_local + (long)local_30 * 0x10 + 8) = 0;
    *(undefined4 *)(*(long *)w_local + (long)local_30 * 0x10 + 4) = 0;
    *(undefined4 *)(*(long *)w_local + (long)local_30 * 0x10 + 0xc) = 0;
  }
  printf("\nHuffmanTree\n");
  n_00 = s1;
  while (local_2c = n_00 + 1, local_2c <= s2) {
    selecte((HuffmanTree *)w_local,n_00,&i,&i_1);
    *(undefined4 *)(*(long *)w_local + (long)i * 0x10 + 4) = 1;
    *(undefined4 *)(*(long *)w_local + (long)i_1 * 0x10 + 4) = 1;
    *(int *)(*(long *)w_local + (long)local_2c * 0x10 + 8) = i;
    *(int *)(*(long *)w_local + (long)local_2c * 0x10 + 0xc) = i_1;
    *(int *)(*(long *)w_local + (long)local_2c * 0x10) =
         *(int *)(*(long *)w_local + (long)i * 0x10) + *(int *)(*(long *)w_local + (long)i_1 * 0x10)
    ;
    printf("%d (%d,%d)\n",(ulong)*(uint *)(*(long *)w_local + (long)local_2c * 0x10),
           (ulong)*(uint *)(*(long *)w_local + (long)i * 0x10),
           (ulong)*(uint *)(*(long *)w_local + (long)i_1 * 0x10));
    n_00 = local_2c;
  }
  printf("\n");
  return;
}

Assistant:

void createHuffmanTree(HuffmanTree *huffmanTree,int w[],int n){
    //m为哈夫曼树总共的节点数，n为叶子结点数
    int m = 2 * n - 1;
    //s1和s2为当前结点里，要选取的最小权值结点
    int s1;
    int s2;
    //标记
    int i;
    //创建哈夫曼树的结点所需要的空间，m + 1,代表其中包含一个头结点
    *huffmanTree = (HuffmanTree)malloc((m + 1) * sizeof(Node));
    //1--n号放叶子节点，初始化叶子结点，初始的时候看做一个个单个结点的二叉树
    for(i = 1;i <= n;i++){
        //其中叶子结点的权值是w【n】数组来保存
        (*huffmanTree)[i].weight = w[i];
        //初始化叶子结点（单个二叉树）的孩子和双亲，单个节点，也就是没有孩子和双亲，==0
        (*huffmanTree)[i].lchild = 0;
        (*huffmanTree)[i].parent = 0;
        (*huffmanTree)[i].rchild = 0;
    }
    //非叶子结点的初始化
    for(int i = n + 1;i <= m;i++){
        (*huffmanTree)[i].weight = 0;
        (*huffmanTree)[i].lchild = 0;
        (*huffmanTree)[i].parent = 0;
        (*huffmanTree)[i].rchild = 0;
    }
    printf("\nHuffmanTree\n");
    //创建非叶子结点，建哈夫曼树
    for(i = n + 1;i <= m; i++){
        //在haffmantree【1】~huffmantree【i - 1】的范围内选择两个parent为0
        //且weight最小的结点，其序号分别为s1，s2
        selecte(huffmanTree,i - 1,&s1,&s2);
        //选出的两个权值最小的叶子结点，组成一个新的二叉树，根为i结点
        (*huffmanTree)[s1].parent = 1;
        (*huffmanTree)[s2].parent = 1;
        (*huffmanTree)[i].lchild = s1;
        (*huffmanTree)[i].rchild = s2;
        //新结点i的权值
        (*huffmanTree)[i].weight = (*huffmanTree)[s1].weight + (*huffmanTree)[s2].weight;
        printf("%d (%d,%d)\n",(*huffmanTree)[i].weight,(*huffmanTree)[s1].weight,(*huffmanTree)[s2].weight);
    }
    printf("\n");
}